

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split.cc
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
absl::StrSplit<std::__cxx11::string>
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,absl *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *text,char delim,
          function<bool_(absl::string_view)> *predicate)

{
  bool bVar1;
  long lVar2;
  undefined7 in_register_00000009;
  long lVar3;
  string_view __args;
  string_view __args_00;
  string_view view;
  string_view local_40;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar3 = 0;
  while( true ) {
    lVar2 = std::__cxx11::string::find((char)this,(ulong)(uint)(int)(char)text);
    if (lVar2 == -1) break;
    local_40.ptr_ = (char *)(lVar3 + *(long *)this);
    local_40.length_ = string_view::CheckLengthInternal(lVar2 - lVar3);
    __args.length_ = local_40.length_;
    __args.ptr_ = local_40.ptr_;
    bVar1 = std::function<bool_(absl::string_view)>::operator()
                      ((function<bool_(absl::string_view)> *)CONCAT71(in_register_00000009,delim),
                       __args);
    if (bVar1) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<absl::string_view&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&local_40);
    }
    lVar3 = lVar2 + 1;
  }
  lVar2 = *(long *)this;
  local_40.ptr_ = (char *)(lVar2 + lVar3);
  local_40.length_ = string_view::CheckLengthInternal(*(long *)(this + 8) - lVar3);
  __args_00.length_ = local_40.length_;
  __args_00.ptr_ = (char *)(lVar2 + lVar3);
  bVar1 = std::function<bool_(absl::string_view)>::operator()
                    ((function<bool_(absl::string_view)> *)CONCAT71(in_register_00000009,delim),
                     __args_00);
  if (bVar1) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<absl::string_view&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<String> StrSplit(String const& text, char const delim,
                        function<bool(string_view)> predicate) {
  vector<String> elems;
  typename String::size_type begin = 0;
  typename String::size_type end;
  while ((end = text.find(delim, begin)) != String::npos) {
    string_view view(text.data() + begin, end - begin);
    if (predicate(view))
      elems.emplace_back(view);
    begin = end + 1;
  }
  // Try to add the portion after the last delim.
  string_view view(text.data() + begin, text.size() - begin);
  if (predicate(view))
    elems.emplace_back(view);
  return elems;
}